

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigWnd.c
# Opt level: O2

void Saig_ManWindowInsertSmall_rec
               (Aig_Man_t *pNew,Aig_Obj_t *pObjSmall,Vec_Ptr_t *vBigNode2SmallPo,
               Vec_Ptr_t *vSmallPi2BigNode)

{
  Aig_Obj_t *pAVar1;
  Aig_Obj_t *p1;
  anon_union_8_3_a781e0d5_for_Aig_Obj_t__13 aVar2;
  
  if ((pObjSmall->field_5).pData == (void *)0x0) {
    pAVar1 = (Aig_Obj_t *)Vec_PtrEntry(vSmallPi2BigNode,pObjSmall->Id);
    if (pAVar1 == (Aig_Obj_t *)0x0) {
      if ((*(uint *)&pObjSmall->field_0x18 & 7) - 7 < 0xfffffffe) {
        __assert_fail("Aig_ObjIsNode(pObjSmall)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigWnd.c"
                      ,0x14d,
                      "void Saig_ManWindowInsertSmall_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                     );
      }
      Saig_ManWindowInsertSmall_rec
                (pNew,(Aig_Obj_t *)((ulong)pObjSmall->pFanin0 & 0xfffffffffffffffe),vBigNode2SmallPo
                 ,vSmallPi2BigNode);
      Saig_ManWindowInsertSmall_rec
                (pNew,(Aig_Obj_t *)((ulong)pObjSmall->pFanin1 & 0xfffffffffffffffe),vBigNode2SmallPo
                 ,vSmallPi2BigNode);
      pAVar1 = Aig_ObjChild0Copy(pObjSmall);
      p1 = Aig_ObjChild1Copy(pObjSmall);
      aVar2.pData = Aig_And(pNew,pAVar1,p1);
    }
    else {
      Saig_ManWindowInsertBig_rec(pNew,pAVar1,vBigNode2SmallPo,vSmallPi2BigNode);
      aVar2 = pAVar1->field_5;
    }
    pObjSmall->field_5 = aVar2;
  }
  return;
}

Assistant:

void Saig_ManWindowInsertSmall_rec( Aig_Man_t * pNew, Aig_Obj_t * pObjSmall, 
         Vec_Ptr_t * vBigNode2SmallPo, Vec_Ptr_t * vSmallPi2BigNode )
{
    Aig_Obj_t * pMatch;
    if ( pObjSmall->pData )
        return;
    if ( (pMatch = (Aig_Obj_t *)Vec_PtrEntry( vSmallPi2BigNode, pObjSmall->Id )) )
    {
        Saig_ManWindowInsertBig_rec( pNew, pMatch, vBigNode2SmallPo, vSmallPi2BigNode );
        pObjSmall->pData = pMatch->pData;
        return;        
    }
    assert( Aig_ObjIsNode(pObjSmall) );
    Saig_ManWindowInsertSmall_rec( pNew, Aig_ObjFanin0(pObjSmall), vBigNode2SmallPo, vSmallPi2BigNode );
    Saig_ManWindowInsertSmall_rec( pNew, Aig_ObjFanin1(pObjSmall), vBigNode2SmallPo, vSmallPi2BigNode );
    pObjSmall->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObjSmall), Aig_ObjChild1Copy(pObjSmall) );
}